

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_failure_tests.cpp
# Opt level: O2

void __thiscall
iu_SPIAssertNonFailureTest_x_iutest_x_Over_Test::Body
          (iu_SPIAssertNonFailureTest_x_iutest_x_Over_Test *this)

{
  TestFlag *pTVar1;
  allocator<char> local_1f1;
  iuCodeMessage local_1f0;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1f0);
  NonFatalFailure2();
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)local_1f0.m_message._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_1f0.m_message);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_failure_tests.cpp"
               ,0x50,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1f0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(SPIAssertNonFailureTest, Over)
{
    IUTEST_ASSERT_NONFATAL_FAILURE(NonFatalFailure2(); , "");
}